

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_cmpb_ppc64(target_ulong rs,target_ulong rb)

{
  undefined4 local_2c;
  ulong uStack_28;
  int i;
  target_ulong ra;
  target_ulong mask;
  target_ulong rb_local;
  target_ulong rs_local;
  
  ra = 0xff;
  uStack_28 = 0;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    if ((rs & ra) == (rb & ra)) {
      uStack_28 = ra | uStack_28;
    }
    ra = ra << 8;
  }
  return uStack_28;
}

Assistant:

target_ulong helper_cmpb(target_ulong rs, target_ulong rb)
{
    target_ulong mask = 0xff;
    target_ulong ra = 0;
    int i;

    for (i = 0; i < sizeof(target_ulong); i++) {
        if ((rs & mask) == (rb & mask)) {
            ra |= mask;
        }
        mask <<= 8;
    }
    return ra;
}